

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O1

bool Diligent::PipelineResourceSignaturesCompatible
               (PipelineResourceSignatureDesc *Desc0,PipelineResourceSignatureDesc *Desc1,
               bool IgnoreSamplerDescriptions)

{
  PipelineResourceDesc *pPVar1;
  PipelineResourceDesc *pPVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  ImmutableSamplerDesc *pIVar6;
  uint uVar7;
  ImmutableSamplerDesc *pIVar8;
  PipelineResourceDesc *pPVar9;
  ulong uVar10;
  PipelineResourceDesc *pPVar12;
  uint uVar13;
  long lVar14;
  bool bVar15;
  ulong uVar11;
  
  if ((Desc0->BindingIndex == Desc1->BindingIndex) &&
     (uVar13 = Desc0->NumResources, uVar13 == Desc1->NumResources)) {
    bVar15 = uVar13 != 0;
    if (bVar15) {
      pPVar1 = Desc0->Resources;
      pPVar2 = Desc1->Resources;
      if (pPVar1->ShaderStages == pPVar2->ShaderStages) {
        pPVar9 = pPVar2;
        pPVar12 = pPVar1;
        uVar7 = 1;
        do {
          if ((((pPVar12->ArraySize != pPVar9->ArraySize) ||
               (pPVar12->ResourceType != pPVar9->ResourceType)) ||
              (pPVar12->VarType != pPVar9->VarType)) || (pPVar12->Flags != pPVar9->Flags)) break;
          if (uVar13 == uVar7) goto LAB_00290668;
          bVar15 = uVar7 <= uVar13 && uVar13 != uVar7;
          pPVar12 = pPVar1 + uVar7;
          pPVar9 = pPVar2 + uVar7;
          uVar10 = (ulong)uVar7;
          uVar11 = (ulong)uVar7;
          uVar7 = uVar7 + 1;
        } while (pPVar1[uVar10].ShaderStages == pPVar2[uVar11].ShaderStages);
      }
      if (bVar15) {
        return false;
      }
    }
LAB_00290668:
    if (Desc0->NumImmutableSamplers == Desc1->NumImmutableSamplers) {
      bVar15 = Desc0->NumImmutableSamplers == 0;
      if (bVar15) {
        return bVar15;
      }
      pIVar8 = Desc0->ImmutableSamplers;
      pIVar6 = Desc1->ImmutableSamplers;
      if (pIVar8->ShaderStages == pIVar6->ShaderStages) {
        uVar13 = 0;
        lVar14 = 0x48;
        do {
          if ((!IgnoreSamplerDescriptions) &&
             (bVar5 = SamplerDesc::operator==(&pIVar8->Desc,&pIVar6->Desc), !bVar5)) {
            return bVar15;
          }
          uVar13 = uVar13 + 1;
          bVar15 = Desc0->NumImmutableSamplers <= uVar13;
          if (bVar15) {
            return bVar15;
          }
          lVar3 = lVar14 + -0x2c;
          pIVar8 = Desc0->ImmutableSamplers + uVar13;
          pIVar6 = Desc1->ImmutableSamplers + uVar13;
          lVar4 = lVar14 + -0x2c;
          lVar14 = lVar14 + 0x48;
        } while (*(int *)((long)(Desc0->ImmutableSamplers->Desc).BorderColor + lVar3) ==
                 *(int *)((long)(Desc1->ImmutableSamplers->Desc).BorderColor + lVar4));
        return bVar15;
      }
      return bVar15;
    }
  }
  return false;
}

Assistant:

bool PipelineResourceSignaturesCompatible(const PipelineResourceSignatureDesc& Desc0,
                                          const PipelineResourceSignatureDesc& Desc1,
                                          bool                                 IgnoreSamplerDescriptions) noexcept
{
    if (Desc0.BindingIndex != Desc1.BindingIndex)
        return false;

    if (Desc0.NumResources != Desc1.NumResources)
        return false;

    for (Uint32 r = 0; r < Desc0.NumResources; ++r)
    {
        if (!PipelineResourcesCompatible(Desc0.Resources[r], Desc1.Resources[r]))
            return false;
    }

    if (Desc0.NumImmutableSamplers != Desc1.NumImmutableSamplers)
        return false;

    for (Uint32 s = 0; s < Desc0.NumImmutableSamplers; ++s)
    {
        const ImmutableSamplerDesc& Samp0 = Desc0.ImmutableSamplers[s];
        const ImmutableSamplerDesc& Samp1 = Desc1.ImmutableSamplers[s];

        if (Samp0.ShaderStages != Samp1.ShaderStages)
            return false;

        if (!IgnoreSamplerDescriptions && Samp0.Desc != Samp1.Desc)
            return false;
    }

    return true;
}